

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  int iVar7;
  Layer *pLVar8;
  uint uVar9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [12];
  unkbyte10 Var12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  unkbyte10 Var15;
  undefined1 auVar16 [12];
  int iVar17;
  undefined1 uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  _func_int **pp_Var22;
  _func_int *p_Var23;
  long lVar24;
  int iVar25;
  undefined4 *puVar26;
  void *pvVar27;
  long lVar28;
  int remain;
  uint uVar29;
  long lVar30;
  int remain_2;
  undefined1 (*pauVar31) [16];
  void *pvVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  void *pvVar36;
  long lVar37;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  int remain_1;
  long lVar38;
  int k;
  int iVar39;
  ulong uVar40;
  void *pvVar41;
  long lVar42;
  uint _elempack;
  size_t sVar43;
  undefined8 *puVar44;
  int g;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  float *pfVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  bool bVar52;
  ushort uVar53;
  float fVar54;
  ushort uVar62;
  int iVar63;
  ushort uVar66;
  int iVar67;
  ushort uVar70;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar64;
  float fVar68;
  float fVar71;
  undefined1 auVar59 [16];
  ushort uVar61;
  ushort uVar65;
  ushort uVar69;
  ushort uVar72;
  undefined1 auVar60 [16];
  int iVar74;
  int iVar81;
  int iVar82;
  __m128 pos;
  int iVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar102;
  float fVar103;
  char cVar104;
  char cVar105;
  float fVar106;
  undefined1 auVar85 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar107;
  float fVar129;
  __m128 pos_1;
  undefined1 auVar108 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar130;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  int iVar131;
  float fVar132;
  short sVar138;
  float fVar137;
  float fVar139;
  __m128 _b;
  float fVar140;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 *local_320;
  void *local_318;
  undefined1 *local_310;
  float *local_2f8;
  long local_2e0;
  byte local_2d8;
  Mat scales;
  Mat top_blob_unpacked;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> requantize_scales;
  _Vector_base<float,_std::allocator<float>_> local_168;
  _Vector_base<float,_std::allocator<float>_> local_150;
  _Vector_base<float,_std::allocator<float>_> local_138;
  _Vector_base<float,_std::allocator<float>_> local_120;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat top_blob_g;
  short sVar73;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar133 [12];
  undefined1 auVar134 [16];
  
  iVar49 = bottom_blob->elempack;
  iVar25 = bottom_blob->c;
  if (iVar49 == 0) {
    bVar52 = false;
  }
  else {
    bVar52 = ((int)bottom_blob->elemsize << 3) / iVar49 == 8;
  }
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var23);
  iVar33 = *(int *)(&this->field_0xdc + (long)p_Var23);
  iVar34 = *(int *)(&this->field_0xd8 + (long)p_Var23);
  iVar39 = *(int *)(&this->field_0xe0 + (long)p_Var23);
  Mat::Mat(&bottom_blob_int8,bottom_blob);
  if (!bVar52) {
    iVar49 = iVar49 * iVar25;
    iVar25 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
    uVar45 = 0;
    Mat::Mat(&scales,iVar49,4,(Allocator *)0x0);
    uVar51 = (long)iVar49 / (long)iVar25;
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
    uVar21 = uVar51 & 0xffffffff;
    puVar26 = (undefined4 *)scales.data;
    if ((int)uVar51 < 1) {
      uVar21 = uVar45;
    }
    for (; (long)uVar45 < (long)*(int *)(&this->field_0x108 + (long)pp_Var22[-3]);
        uVar45 = uVar45 + 1) {
      uVar6 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var22[-3]) + uVar45 * 4);
      uVar51 = uVar21;
      while (iVar49 = (int)uVar51, uVar51 = (ulong)(iVar49 - 1), iVar49 != 0) {
        *puVar26 = uVar6;
        puVar26 = puVar26 + 1;
      }
    }
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,&scales,(Option *)&top_blob_unpacked);
    Mat::~Mat(&scales);
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),&bottom_blob_int8,&bottom_blob_bordered
             ,opt);
  iVar67 = bottom_blob_bordered.c;
  iVar63 = bottom_blob_bordered.w;
  iVar25 = bottom_blob_bordered.elempack;
  iVar49 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_00264937;
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar33 = (~((iVar20 + -1) * iVar33) + bottom_blob_bordered.w) /
           *(int *)(&this->field_0xe4 + (long)p_Var23);
  iVar20 = (~((iVar34 + -1) * iVar39) + bottom_blob_bordered.h) /
           *(int *)(&this->field_0xe8 + (long)p_Var23);
  iVar34 = iVar33 + 1;
  iVar39 = iVar20 + 1;
  uVar29 = bottom_blob_bordered.elempack * bottom_blob_bordered.c;
  if ((uVar29 == *(uint *)(&this->field_0x108 + (long)p_Var23)) &&
     (uVar29 == *(uint *)(&this->field_0xd0 + (long)p_Var23))) {
    uVar50 = 8;
    if (opt->use_packing_layout == false) {
      uVar50 = 1;
    }
    if ((uVar29 & 7) != 0) {
      uVar50 = 1;
    }
    iVar7 = *(int *)(&this->field_0x10c + (long)p_Var23);
    uVar9 = uVar50 * 4;
    if (100 < iVar7) {
      uVar9 = uVar50;
    }
    Mat::create(top_blob,iVar34,iVar39,(int)uVar29 / (int)uVar50,(ulong)uVar9,uVar50,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_00264937;
    iVar49 = 0;
    if (iVar25 == 1) {
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar49 = *(int *)(&this->field_0xd8 + (long)p_Var23);
      if (iVar49 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var23) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var23) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var23) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var23) < 2)))) {
          if (iVar7 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar37 = 0; p_Var23 = pp_Var22[-3],
                lVar37 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar37 = lVar37 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var23) + lVar37 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var23) + lVar37 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_138,&requantize_scales);
            lVar28 = (long)bottom_blob_bordered.w;
            iVar49 = top_blob->w;
            lVar37 = *(long *)(&this->field_0x168 + (long)p_Var23);
            lVar38 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            uVar51 = 0;
            iVar25 = top_blob->h;
            if (top_blob->h < 1) {
              iVar25 = 0;
            }
            uVar21 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar21 = uVar51;
            }
            for (; uVar51 != uVar21; uVar51 = uVar51 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar51);
              pvVar32 = scales.data;
              if (lVar38 == 0) {
                fVar54 = 0.0;
              }
              else {
                fVar54 = *(float *)(lVar38 + uVar51 * 4);
              }
              fVar64 = local_138._M_impl.super__Vector_impl_data._M_start[uVar51];
              Mat::fill(&scales,fVar54);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar51);
              pvVar41 = top_blob_unpacked.data;
              lVar47 = uVar51 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar24 = lVar28 + (long)pvVar41;
              pvVar27 = (void *)(lVar28 * 2 + (long)pvVar41);
              for (iVar20 = 0; iVar20 != iVar25; iVar20 = iVar20 + 1) {
                lVar42 = 0;
                pvVar36 = pvVar32;
                for (iVar33 = iVar49; 0 < iVar33; iVar33 = iVar33 + -1) {
                  *(float *)((long)pvVar32 + lVar42 * 4) =
                       (float)((int)*(char *)(lVar37 + 8 + lVar47) *
                               (int)*(char *)((long)pvVar27 + lVar42 + 2) +
                               (int)*(char *)(lVar37 + 7 + lVar47) *
                               (int)*(char *)((long)pvVar27 + lVar42 + 1) +
                              (int)*(char *)(lVar37 + 6 + lVar47) *
                              (int)*(char *)((long)pvVar27 + lVar42) +
                              (int)*(char *)(lVar37 + 5 + lVar47) *
                              (int)*(char *)(lVar24 + 2 + lVar42) +
                              (int)*(char *)(lVar37 + 4 + lVar47) *
                              (int)*(char *)(lVar24 + 1 + lVar42) +
                              (int)*(char *)(lVar37 + 3 + lVar47) * (int)*(char *)(lVar24 + lVar42)
                              + (int)*(char *)(lVar37 + 2 + lVar47) *
                                (int)*(char *)((long)pvVar41 + lVar42 + 2) +
                              (int)*(char *)(lVar37 + 1 + lVar47) *
                              (int)*(char *)((long)pvVar41 + lVar42 + 1) +
                              (int)*(char *)(lVar37 + lVar47) *
                              (int)*(char *)((long)pvVar41 + lVar42)) * fVar64 +
                       *(float *)((long)pvVar32 + lVar42 * 4);
                  pvVar36 = (void *)((long)pvVar36 + 4);
                  lVar42 = lVar42 + 1;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar42 + 2);
                lVar24 = lVar24 + lVar42 + 2;
                pvVar27 = (void *)((long)pvVar27 + lVar42 + 2);
                pvVar32 = pvVar36;
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_138;
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar37 = 0; p_Var23 = pp_Var22[-3],
                lVar37 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar37 = lVar37 + 1) {
              fVar54 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar37 * 4);
              fVar64 = 0.0;
              if (fVar54 != 0.0) {
                fVar64 = 1.0 / (fVar54 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                                   lVar37 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar64);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var23) + lVar37 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&top_blob_unpacked);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_120,&requantize_scales);
            lVar28 = (long)bottom_blob_bordered.w;
            iVar49 = top_blob->w;
            iVar25 = top_blob->h;
            lVar37 = *(long *)(&this->field_0x168 + (long)p_Var23);
            lVar38 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            uVar51 = 0;
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            uVar21 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar21 = uVar51;
            }
            while( true ) {
              if (uVar51 == uVar21) break;
              Mat::channel(&scales,top_blob,(int)uVar51);
              if (lVar38 == 0) {
                fVar54 = 0.0;
              }
              else {
                fVar54 = *(float *)(lVar38 + uVar51 * 4);
              }
              local_318 = scales.data;
              fVar64 = local_120._M_impl.super__Vector_impl_data._M_start[uVar51 * 2];
              fVar68 = local_120._M_impl.super__Vector_impl_data._M_start[uVar51 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar51);
              local_310 = (undefined1 *)top_blob_unpacked.data;
              lVar24 = uVar51 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar47 = (long)local_310 + lVar28;
              pvVar32 = (void *)((long)local_310 + lVar28 * 2);
              for (iVar20 = 0; iVar20 != iVar25; iVar20 = iVar20 + 1) {
                lVar42 = 0;
                for (iVar33 = iVar49; 0 < iVar33; iVar33 = iVar33 + -1) {
                  fVar71 = roundf(((float)((int)*(char *)(lVar37 + 8 + lVar24) *
                                           (int)*(char *)((long)pvVar32 + lVar42 + 2) +
                                           (int)*(char *)(lVar37 + 7 + lVar24) *
                                           (int)*(char *)((long)pvVar32 + lVar42 + 1) +
                                          (int)*(char *)(lVar37 + 6 + lVar24) *
                                          (int)*(char *)((long)pvVar32 + lVar42) +
                                          (int)*(char *)(lVar37 + 5 + lVar24) *
                                          (int)*(char *)(lVar47 + 2 + lVar42) +
                                          (int)*(char *)(lVar37 + 4 + lVar24) *
                                          (int)*(char *)(lVar47 + 1 + lVar42) +
                                          (int)*(char *)(lVar37 + 3 + lVar24) *
                                          (int)*(char *)(lVar47 + lVar42) +
                                          (int)*(char *)(lVar37 + 2 + lVar24) *
                                          (int)*(char *)((long)local_310 + lVar42 + 2) +
                                          (int)*(char *)(lVar37 + 1 + lVar24) *
                                          (int)*(char *)((long)local_310 + lVar42 + 1) +
                                          (int)*(char *)(lVar37 + lVar24) *
                                          (int)*(char *)((long)local_310 + lVar42)) * fVar64 +
                                  fVar54) * fVar68);
                  iVar34 = (int)fVar71;
                  if (iVar34 < -0x7e) {
                    iVar34 = -0x7f;
                  }
                  if (0x7e < iVar34) {
                    iVar34 = 0x7f;
                  }
                  *(char *)((long)local_318 + lVar42) = (char)iVar34;
                  lVar42 = lVar42 + 1;
                }
                local_310 = (undefined1 *)((long)local_310 + lVar42 + 2);
                lVar47 = lVar47 + lVar42 + 2;
                pvVar32 = (void *)((long)pvVar32 + lVar42 + 2);
                local_318 = (void *)((long)local_318 + lVar42);
              }
              Mat::~Mat(&scales);
              uVar51 = uVar51 + 1;
            }
            this_00 = &local_120;
          }
        }
        else {
          iVar49 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var23) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var23) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var23) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var23) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var23))) goto LAB_00265912;
          if (iVar7 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar37 = 0; p_Var23 = pp_Var22[-3],
                lVar37 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar37 = lVar37 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var23) + lVar37 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var23) + lVar37 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_168,&requantize_scales);
            lVar28 = (long)bottom_blob_bordered.w;
            iVar49 = top_blob->w;
            lVar37 = *(long *)(&this->field_0x168 + (long)p_Var23);
            lVar38 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            lVar47 = (long)((bottom_blob_bordered.w - iVar49) * 2);
            uVar51 = 0;
            iVar25 = top_blob->h;
            if (top_blob->h < 1) {
              iVar25 = 0;
            }
            uVar21 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar21 = uVar51;
            }
            for (; uVar51 != uVar21; uVar51 = uVar51 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar51);
              pfVar48 = (float *)scales.data;
              if (lVar38 == 0) {
                fVar54 = 0.0;
              }
              else {
                fVar54 = *(float *)(lVar38 + uVar51 * 4);
              }
              fVar64 = local_168._M_impl.super__Vector_impl_data._M_start[uVar51];
              Mat::fill(&scales,fVar54);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar51);
              pvVar32 = top_blob_unpacked.data;
              lVar24 = uVar51 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar42 = lVar28 + (long)pvVar32;
              pvVar41 = (void *)(lVar28 * 2 + (long)pvVar32);
              for (iVar20 = 0; iVar20 != iVar25; iVar20 = iVar20 + 1) {
                lVar30 = 0;
                for (iVar33 = iVar49; 0 < iVar33; iVar33 = iVar33 + -1) {
                  *pfVar48 = (float)((int)*(char *)(lVar37 + 8 + lVar24) *
                                     (int)*(char *)((long)pvVar41 + lVar30 + 2) +
                                     (int)*(char *)(lVar37 + 7 + lVar24) *
                                     (int)*(char *)((long)pvVar41 + lVar30 + 1) +
                                    (int)*(char *)(lVar37 + 6 + lVar24) *
                                    (int)*(char *)((long)pvVar41 + lVar30) +
                                    (int)*(char *)(lVar37 + 5 + lVar24) *
                                    (int)*(char *)(lVar42 + 2 + lVar30) +
                                    (int)*(char *)(lVar37 + 4 + lVar24) *
                                    (int)*(char *)(lVar42 + 1 + lVar30) +
                                    (int)*(char *)(lVar37 + 3 + lVar24) *
                                    (int)*(char *)(lVar42 + lVar30) +
                                    (int)*(char *)(lVar37 + 2 + lVar24) *
                                    (int)*(char *)((long)pvVar32 + lVar30 + 2) +
                                    (int)*(char *)(lVar37 + 1 + lVar24) *
                                    (int)*(char *)((long)pvVar32 + lVar30 + 1) +
                                    (int)*(char *)(lVar37 + lVar24) *
                                    (int)*(char *)((long)pvVar32 + lVar30)) * fVar64 + *pfVar48;
                  pfVar48 = pfVar48 + 1;
                  lVar30 = lVar30 + 2;
                }
                pvVar32 = (void *)((long)pvVar32 + lVar30 + lVar47);
                lVar42 = lVar42 + lVar47 + lVar30;
                pvVar41 = (void *)((long)pvVar41 + lVar30 + lVar47);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_168;
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar37 = 0; p_Var23 = pp_Var22[-3],
                lVar37 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar37 = lVar37 + 1) {
              fVar54 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar37 * 4);
              fVar64 = 0.0;
              if (fVar54 != 0.0) {
                fVar64 = 1.0 / (fVar54 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                                   lVar37 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar64);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var23) + lVar37 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&top_blob_unpacked);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_150,&requantize_scales);
            lVar47 = (long)bottom_blob_bordered.w;
            iVar49 = top_blob->w;
            iVar25 = top_blob->h;
            lVar37 = *(long *)(&this->field_0x168 + (long)p_Var23);
            lVar38 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            lVar28 = (long)((bottom_blob_bordered.w - iVar49) * 2);
            uVar51 = 0;
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            uVar21 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar21 = uVar51;
            }
            for (; uVar51 != uVar21; uVar51 = uVar51 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar51);
              if (lVar38 == 0) {
                fVar54 = 0.0;
              }
              else {
                fVar54 = *(float *)(lVar38 + uVar51 * 4);
              }
              local_310 = (undefined1 *)scales.data;
              fVar64 = local_150._M_impl.super__Vector_impl_data._M_start[uVar51 * 2];
              fVar68 = local_150._M_impl.super__Vector_impl_data._M_start[uVar51 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar51);
              local_318 = top_blob_unpacked.data;
              lVar42 = uVar51 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar24 = (long)local_318 + lVar47;
              pvVar32 = (void *)((long)local_318 + lVar47 * 2);
              for (iVar20 = 0; iVar20 != iVar25; iVar20 = iVar20 + 1) {
                lVar30 = 0;
                for (iVar33 = iVar49; 0 < iVar33; iVar33 = iVar33 + -1) {
                  fVar71 = roundf(((float)((int)*(char *)(lVar37 + 8 + lVar42) *
                                           (int)*(char *)((long)pvVar32 + lVar30 + 2) +
                                           (int)*(char *)(lVar37 + 7 + lVar42) *
                                           (int)*(char *)((long)pvVar32 + lVar30 + 1) +
                                          (int)*(char *)(lVar37 + 6 + lVar42) *
                                          (int)*(char *)((long)pvVar32 + lVar30) +
                                          (int)*(char *)(lVar37 + 5 + lVar42) *
                                          (int)*(char *)(lVar24 + 2 + lVar30) +
                                          (int)*(char *)(lVar37 + 4 + lVar42) *
                                          (int)*(char *)(lVar24 + 1 + lVar30) +
                                          (int)*(char *)(lVar37 + 3 + lVar42) *
                                          (int)*(char *)(lVar24 + lVar30) +
                                          (int)*(char *)(lVar37 + 2 + lVar42) *
                                          (int)*(char *)((long)local_318 + lVar30 + 2) +
                                          (int)*(char *)(lVar37 + 1 + lVar42) *
                                          (int)*(char *)((long)local_318 + lVar30 + 1) +
                                          (int)*(char *)(lVar37 + lVar42) *
                                          (int)*(char *)((long)local_318 + lVar30)) * fVar64 +
                                  fVar54) * fVar68);
                  iVar34 = (int)fVar71;
                  if (iVar34 < -0x7e) {
                    iVar34 = -0x7f;
                  }
                  if (0x7e < iVar34) {
                    iVar34 = 0x7f;
                  }
                  *local_310 = (char)iVar34;
                  local_310 = local_310 + 1;
                  lVar30 = lVar30 + 2;
                }
                local_318 = (void *)((long)local_318 + lVar30 + lVar28);
                lVar24 = lVar24 + lVar28 + lVar30;
                pvVar32 = (void *)((long)pvVar32 + lVar30 + lVar28);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_150;
          }
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        iVar49 = 0;
        pLVar8 = this->activation;
        if (pLVar8 != (Layer *)0x0) {
          (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
        }
        goto LAB_00264937;
      }
LAB_00265912:
      uVar29 = iVar49 * *(int *)(&this->field_0xd4 + (long)p_Var23);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,(long)(int)uVar29,
                 (allocator_type *)&scales);
      pvVar32 = top_blob_unpacked.data;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar49 = *(int *)(&this->field_0xe0 + (long)p_Var23);
      iVar25 = *(int *)(&this->field_0xdc + (long)p_Var23);
      iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var23);
      lVar37 = 0;
      iVar39 = 0;
      for (iVar67 = 0; iVar67 < *(int *)(&this->field_0xd8 + (long)p_Var23); iVar67 = iVar67 + 1) {
        for (lVar38 = 0; (int)lVar38 < *(int *)(&this->field_0xd4 + (long)p_Var23);
            lVar38 = lVar38 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar38 * 4 + (long)(int)lVar37 * 4) = iVar39;
          p_Var23 = pp_Var22[-3];
          iVar39 = iVar39 + *(int *)(&this->field_0xdc + (long)p_Var23);
        }
        iVar39 = iVar39 + (iVar63 * iVar49 - iVar25 * iVar34);
        lVar37 = (int)lVar37 + lVar38;
      }
      local_2e0 = 0;
      uVar50 = uVar29;
      if ((int)uVar29 < 1) {
        uVar50 = 0;
      }
      for (lVar37 = 0; lVar37 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar37 = lVar37 + 1) {
        iVar49 = (int)lVar37;
        Mat::channel(&scales,top_blob,iVar49);
        local_320 = (undefined1 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar49);
        local_2f8 = (float *)scales.data;
        Mat::~Mat(&scales);
        lVar38 = *(long *)(&this->field_0x168 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
        Mat::channel(&scales,&bottom_blob_bordered,iVar49);
        for (iVar49 = 0; iVar49 <= iVar20; iVar49 = iVar49 + 1) {
          pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
          for (iVar25 = 0; iVar25 <= iVar33; iVar25 = iVar25 + 1) {
            p_Var23 = pp_Var22[-3];
            iVar34 = 0;
            for (uVar51 = 0; uVar50 != uVar51; uVar51 = uVar51 + 1) {
              iVar34 = iVar34 + (int)*(char *)(lVar38 + local_2e0 + uVar51) *
                                (int)*(char *)((long)scales.data +
                                              (long)*(int *)((long)pvVar32 + uVar51 * 4) +
                                              (long)iVar25 *
                                              (long)*(int *)(&this->field_0xe4 + (long)p_Var23) +
                                              (long)scales.w * (long)iVar49 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var23) *
                                              scales.elemsize);
            }
            fVar54 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar37 * 4);
            fVar64 = 0.0;
            if (fVar54 != 0.0) {
              fVar64 = 1.0 / (fVar54 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                                 lVar37 * 4));
            }
            fVar64 = (float)iVar34 * fVar64;
            if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
              fVar64 = fVar64 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) +
                                          lVar37 * 4);
            }
            fVar54 = fVar64;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var23)) {
            case 1:
              if (fVar64 <= 0.0) {
                fVar54 = 0.0;
              }
              break;
            case 2:
              fVar54 = (float)(-(uint)(0.0 < fVar64) & 0x3f800000 |
                              ~-(uint)(0.0 < fVar64) &
                              **(uint **)(&this->field_0x118 + (long)p_Var23)) * fVar64;
              break;
            case 3:
              fVar54 = **(float **)(&this->field_0x118 + (long)p_Var23);
              if (fVar64 <= fVar54) {
                fVar64 = fVar54;
              }
              fVar68 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              fVar54 = fVar64;
              if (fVar68 <= fVar64) {
                fVar54 = fVar68;
              }
              break;
            case 4:
              fVar54 = expf(-fVar64);
              fVar54 = 1.0 / (fVar54 + 1.0);
              break;
            case 5:
              fVar54 = expf(fVar64);
              fVar54 = logf(fVar54 + 1.0);
              fVar54 = tanhf(fVar54);
              fVar54 = fVar54 * fVar64;
              break;
            case 6:
              fVar68 = **(float **)(&this->field_0x118 + (long)p_Var23);
              fVar71 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              fVar84 = -fVar71 / fVar68;
              fVar54 = 0.0;
              if ((fVar84 <= fVar64) && (fVar54 = fVar64, fVar64 <= fVar84 + 1.0 / fVar68)) {
                fVar54 = (fVar68 * fVar64 + fVar71) * fVar64;
              }
            }
            if (iVar7 < 0x65) {
              *local_2f8 = fVar54;
              local_2f8 = local_2f8 + 1;
            }
            else {
              fVar54 = roundf(fVar54 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var23) +
                                                 lVar37 * 4));
              iVar34 = (int)fVar54;
              if (iVar34 < -0x7e) {
                iVar34 = -0x7f;
              }
              uVar18 = (undefined1)iVar34;
              if (0x7e < iVar34) {
                uVar18 = 0x7f;
              }
              *local_320 = uVar18;
              local_320 = local_320 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
        local_2e0 = local_2e0 + (int)uVar29;
      }
    }
    else {
      if (iVar25 != 8) goto LAB_00264937;
      uVar51 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,uVar51,
                 (allocator_type *)&scales);
      pvVar32 = top_blob_unpacked.data;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar49 = *(int *)(&this->field_0xe0 + (long)p_Var23);
      iVar25 = *(int *)(&this->field_0xdc + (long)p_Var23);
      iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var23);
      iVar35 = 0;
      lVar37 = 0;
      for (iVar39 = 0; iVar39 < *(int *)(&this->field_0xd8 + (long)p_Var23); iVar39 = iVar39 + 1) {
        for (lVar38 = 0; (int)lVar38 < *(int *)(&this->field_0xd4 + (long)p_Var23);
            lVar38 = lVar38 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar38 * 4 + (long)(int)lVar37 * 4) = iVar35;
          p_Var23 = pp_Var22[-3];
          iVar35 = iVar35 + *(int *)(&this->field_0xdc + (long)p_Var23);
        }
        iVar35 = iVar35 + (iVar63 * iVar49 - iVar25 * iVar34);
        lVar37 = (int)lVar37 + lVar38;
      }
      uVar21 = uVar51 & 0xffffffff;
      if ((int)uVar51 < 1) {
        uVar21 = 0;
      }
      iVar49 = 0;
      uVar45 = (ulong)(uint)iVar67;
      if (iVar67 < 1) {
        uVar45 = 0;
      }
      for (uVar46 = 0; uVar46 != uVar45; uVar46 = uVar46 + 1) {
        iVar25 = (int)uVar46;
        Mat::channel(&scales,top_blob,iVar25);
        puVar44 = (undefined8 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar25);
        pauVar31 = (undefined1 (*) [16])scales.data;
        Mat::~Mat(&scales);
        pvVar41 = (this->weight_data_int8).data;
        Mat::channel(&scales,&bottom_blob_bordered,iVar25);
        for (iVar25 = 0; iVar25 <= iVar20; iVar25 = iVar25 + 1) {
          pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
          for (iVar34 = 0; iVar34 <= iVar33; iVar34 = iVar34 + 1) {
            p_Var23 = pp_Var22[-3];
            iVar39 = 0;
            iVar63 = 0;
            iVar67 = 0;
            iVar35 = 0;
            iVar74 = 0;
            iVar81 = 0;
            iVar82 = 0;
            iVar83 = 0;
            for (uVar40 = 0; uVar21 != uVar40; uVar40 = uVar40 + 1) {
              uVar5 = *(ulong *)((long)scales.data +
                                (long)*(int *)((long)pvVar32 + uVar40 * 4) * 8 +
                                (long)(*(int *)(&this->field_0xe4 + (long)p_Var23) * iVar34 * 8) +
                                (long)scales.w * (long)iVar25 *
                                (long)*(int *)(&this->field_0xe8 + (long)p_Var23) * scales.elemsize)
              ;
              cVar99 = (char)(uVar5 >> 8);
              cVar100 = (char)(uVar5 >> 0x10);
              cVar101 = (char)(uVar5 >> 0x18);
              cVar102 = (char)(uVar5 >> 0x20);
              cVar104 = (char)(uVar5 >> 0x28);
              cVar105 = (char)(uVar5 >> 0x30);
              auVar116._8_6_ = 0;
              auVar116._0_8_ = uVar5;
              auVar116[0xe] = (char)(uVar5 >> 0x38);
              auVar116[0xf] = -((long)uVar5 < 0);
              auVar90._14_2_ = auVar116._14_2_;
              auVar90._8_5_ = 0;
              auVar90._0_8_ = uVar5;
              auVar90[0xd] = -(cVar105 < '\0');
              auVar89._13_3_ = auVar90._13_3_;
              auVar89._8_4_ = 0;
              auVar89._0_8_ = uVar5;
              auVar89[0xc] = cVar105;
              auVar88._12_4_ = auVar89._12_4_;
              auVar88._8_3_ = 0;
              auVar88._0_8_ = uVar5;
              auVar88[0xb] = -(cVar104 < '\0');
              auVar87._11_5_ = auVar88._11_5_;
              auVar87._8_2_ = 0;
              auVar87._0_8_ = uVar5;
              auVar87[10] = cVar104;
              auVar86._10_6_ = auVar87._10_6_;
              auVar86[8] = 0;
              auVar86._0_8_ = uVar5;
              auVar86[9] = -(cVar102 < '\0');
              auVar85._9_7_ = auVar86._9_7_;
              auVar85[8] = cVar102;
              auVar85._0_8_ = uVar5;
              Var12 = CONCAT91(CONCAT81(auVar85._8_8_,-(cVar101 < '\0')),cVar101);
              auVar11._2_10_ = Var12;
              auVar11[1] = -(cVar100 < '\0');
              auVar11[0] = cVar100;
              auVar10._2_12_ = auVar11;
              auVar10[1] = -(cVar99 < '\0');
              auVar10[0] = cVar99;
              auVar92._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
              auVar92._2_14_ = auVar10;
              uVar5 = *(ulong *)((long)pvVar41 + uVar40 * 8 + (long)iVar49);
              cVar99 = (char)(uVar5 >> 8);
              cVar100 = (char)(uVar5 >> 0x10);
              cVar101 = (char)(uVar5 >> 0x18);
              cVar102 = (char)(uVar5 >> 0x20);
              cVar104 = (char)(uVar5 >> 0x28);
              cVar105 = (char)(uVar5 >> 0x30);
              auVar115._8_6_ = 0;
              auVar115._0_8_ = uVar5;
              auVar115[0xe] = (char)(uVar5 >> 0x38);
              auVar115[0xf] = -((long)uVar5 < 0);
              auVar114._14_2_ = auVar115._14_2_;
              auVar114._8_5_ = 0;
              auVar114._0_8_ = uVar5;
              auVar114[0xd] = -(cVar105 < '\0');
              auVar113._13_3_ = auVar114._13_3_;
              auVar113._8_4_ = 0;
              auVar113._0_8_ = uVar5;
              auVar113[0xc] = cVar105;
              auVar112._12_4_ = auVar113._12_4_;
              auVar112._8_3_ = 0;
              auVar112._0_8_ = uVar5;
              auVar112[0xb] = -(cVar104 < '\0');
              auVar111._11_5_ = auVar112._11_5_;
              auVar111._8_2_ = 0;
              auVar111._0_8_ = uVar5;
              auVar111[10] = cVar104;
              auVar110._10_6_ = auVar111._10_6_;
              auVar110[8] = 0;
              auVar110._0_8_ = uVar5;
              auVar110[9] = -(cVar102 < '\0');
              auVar109._9_7_ = auVar110._9_7_;
              auVar109[8] = cVar102;
              auVar109._0_8_ = uVar5;
              Var15 = CONCAT91(CONCAT81(auVar109._8_8_,-(cVar101 < '\0')),cVar101);
              auVar14._2_10_ = Var15;
              auVar14[1] = -(cVar100 < '\0');
              auVar14[0] = cVar100;
              auVar13._2_12_ = auVar14;
              auVar13[1] = -(cVar99 < '\0');
              auVar13[0] = cVar99;
              auVar108._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
              auVar108._2_14_ = auVar13;
              sVar138 = (short)Var15 * (short)Var12;
              auVar116 = pmulhw(auVar108,auVar92);
              iVar17 = CONCAT22(auVar116._6_2_,sVar138);
              Var12 = CONCAT64(CONCAT42(iVar17,auVar116._4_2_),
                               CONCAT22(auVar14._0_2_ * auVar11._0_2_,sVar138));
              auVar16._4_8_ = (long)((unkuint10)Var12 >> 0x10);
              auVar16._2_2_ = auVar116._2_2_;
              auVar16._0_2_ = auVar13._0_2_ * auVar10._0_2_;
              iVar131 = CONCAT22(auVar116._8_2_,auVar109._8_2_ * auVar85._8_2_);
              auVar133._0_8_ =
                   CONCAT26(auVar116._10_2_,CONCAT24(auVar111._10_2_ * auVar87._10_2_,iVar131));
              auVar133._8_2_ = auVar113._12_2_ * auVar89._12_2_;
              auVar133._10_2_ = auVar116._12_2_;
              auVar134._12_2_ = auVar114._14_2_ * auVar90._14_2_;
              auVar134._0_12_ = auVar133;
              auVar134._14_2_ = auVar116._14_2_;
              iVar74 = iVar74 + CONCAT22(auVar116._0_2_,auVar108._0_2_ * auVar92._0_2_);
              iVar81 = iVar81 + auVar16._0_4_;
              iVar82 = iVar82 + (int)((unkuint10)Var12 >> 0x10);
              iVar83 = iVar83 + iVar17;
              iVar39 = iVar39 + iVar131;
              iVar63 = iVar63 + (int)((ulong)auVar133._0_8_ >> 0x20);
              iVar67 = iVar67 + auVar133._8_4_;
              iVar35 = iVar35 + auVar134._12_4_;
            }
            pfVar48 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + uVar46 * 0x20);
            pfVar2 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + 0x10 + uVar46 * 0x20)
            ;
            pfVar1 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + uVar46 * 0x20);
            pfVar3 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + 0x10 + uVar46 * 0x20)
            ;
            auVar91._0_4_ = *pfVar48 * *pfVar1;
            auVar91._4_4_ = pfVar48[1] * pfVar1[1];
            auVar91._8_4_ = pfVar48[2] * pfVar1[2];
            auVar91._12_4_ = pfVar48[3] * pfVar1[3];
            auVar92 = rcpps(auVar91,auVar91);
            auVar117._0_4_ = *pfVar2 * *pfVar3;
            auVar117._4_4_ = pfVar2[1] * pfVar3[1];
            auVar117._8_4_ = pfVar2[2] * pfVar3[2];
            auVar117._12_4_ = pfVar2[3] * pfVar3[3];
            auVar116 = rcpps(auVar117,auVar117);
            auVar93._0_4_ = (float)iVar74 * (float)(-(uint)(*pfVar1 != 0.0) & auVar92._0_4_);
            auVar93._4_4_ = (float)iVar81 * (float)(-(uint)(pfVar1[1] != 0.0) & auVar92._4_4_);
            auVar93._8_4_ = (float)iVar82 * (float)(-(uint)(pfVar1[2] != 0.0) & auVar92._8_4_);
            auVar93._12_4_ = (float)iVar83 * (float)(-(uint)(pfVar1[3] != 0.0) & auVar92._12_4_);
            auVar55._0_4_ = (float)iVar39 * (float)(-(uint)(*pfVar3 != 0.0) & auVar116._0_4_);
            auVar55._4_4_ = (float)iVar63 * (float)(-(uint)(pfVar3[1] != 0.0) & auVar116._4_4_);
            auVar55._8_4_ = (float)iVar67 * (float)(-(uint)(pfVar3[2] != 0.0) & auVar116._8_4_);
            auVar55._12_4_ = (float)iVar35 * (float)(-(uint)(pfVar3[3] != 0.0) & auVar116._12_4_);
            if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
              pfVar48 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) + uVar46 * 0x20);
              pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) + 0x10 +
                                uVar46 * 0x20);
              auVar93._0_4_ = auVar93._0_4_ + *pfVar48;
              auVar93._4_4_ = auVar93._4_4_ + pfVar48[1];
              auVar93._8_4_ = auVar93._8_4_ + pfVar48[2];
              auVar93._12_4_ = auVar93._12_4_ + pfVar48[3];
              auVar55._0_4_ = auVar55._0_4_ + *pfVar1;
              auVar55._4_4_ = auVar55._4_4_ + pfVar1[1];
              auVar55._8_4_ = auVar55._8_4_ + pfVar1[2];
              auVar55._12_4_ = auVar55._12_4_ + pfVar1[3];
            }
            auVar75 = auVar93;
            auVar118 = auVar55;
            if (5 < *(int *)(&this->field_0x110 + (long)p_Var23) - 1U)
            goto switchD_0026506b_caseD_1;
            fVar68 = auVar93._0_4_;
            fVar71 = auVar93._4_4_;
            fVar84 = auVar93._8_4_;
            fVar103 = auVar93._12_4_;
            auVar75 = maxps(auVar93,ZEXT816(0));
            fVar54 = auVar55._8_4_;
            fVar64 = auVar55._12_4_;
            auVar118 = maxps(auVar55,ZEXT816(0));
            switch(*(int *)(&this->field_0x110 + (long)p_Var23)) {
            case 2:
              auVar92 = minps(auVar93,ZEXT816(0));
              fVar54 = **(float **)(&this->field_0x118 + (long)p_Var23);
              auVar76._0_4_ = auVar75._0_4_ + auVar92._0_4_ * fVar54;
              auVar76._4_4_ = auVar75._4_4_ + auVar92._4_4_ * fVar54;
              auVar76._8_4_ = auVar75._8_4_ + auVar92._8_4_ * fVar54;
              auVar76._12_4_ = auVar75._12_4_ + auVar92._12_4_ * fVar54;
              auVar92 = minps(auVar55,ZEXT816(0));
              auVar58._0_4_ = auVar92._0_4_ * fVar54;
              auVar58._4_4_ = auVar92._4_4_ * fVar54;
              auVar58._8_4_ = auVar92._8_4_ * fVar54;
              auVar58._12_4_ = auVar92._12_4_ * fVar54;
              goto LAB_002656ff;
            case 3:
              uVar6 = **(undefined4 **)(&this->field_0x118 + (long)p_Var23);
              uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var23))[1];
              auVar78._4_4_ = uVar6;
              auVar78._0_4_ = uVar6;
              auVar78._8_4_ = uVar6;
              auVar78._12_4_ = uVar6;
              auVar124._4_4_ = uVar4;
              auVar124._0_4_ = uVar4;
              auVar124._8_4_ = uVar4;
              auVar124._12_4_ = uVar4;
              auVar92 = maxps(auVar93,auVar78);
              auVar75 = minps(auVar92,auVar124);
              auVar92 = maxps(auVar55,auVar78);
              auVar118 = minps(auVar92,auVar124);
              break;
            case 4:
              auVar96._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
              auVar96._8_4_ = -fVar84;
              auVar96._12_4_ = -fVar103;
              auVar92 = minps(auVar96,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar106 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar107 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar129 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar130 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar68 = (float)(int)fVar106;
              fVar71 = (float)(int)fVar107;
              fVar84 = (float)(int)fVar129;
              fVar103 = (float)(int)fVar130;
              fVar68 = fVar68 - (float)(-(uint)(fVar106 < fVar68) & 0x3f800000);
              fVar71 = fVar71 - (float)(-(uint)(fVar107 < fVar71) & 0x3f800000);
              fVar84 = fVar84 - (float)(-(uint)(fVar129 < fVar84) & 0x3f800000);
              fVar103 = fVar103 - (float)(-(uint)(fVar130 < fVar103) & 0x3f800000);
              fVar106 = auVar92._0_4_ - fVar68 * 0.6931472;
              fVar107 = auVar92._4_4_ - fVar71 * 0.6931472;
              fVar129 = auVar92._8_4_ - fVar84 * 0.6931472;
              fVar130 = auVar92._12_4_ - fVar103 * 0.6931472;
              auVar97._0_4_ =
                   fVar106 + 1.0 +
                   (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                     0.041665796) * fVar106 + (float)DAT_002eff30) * fVar106 + 0.5) *
                   fVar106 * fVar106;
              auVar97._4_4_ =
                   fVar107 + 1.0 +
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + DAT_002eff30._4_4_) * fVar107 + 0.5) *
                   fVar107 * fVar107;
              auVar97._8_4_ =
                   fVar129 + 1.0 +
                   (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                     0.041665796) * fVar129 + DAT_002eff30._8_4_) * fVar129 + 0.5) *
                   fVar129 * fVar129;
              auVar97._12_4_ =
                   fVar130 + 1.0 +
                   (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                     0.041665796) * fVar130 + DAT_002eff30._12_4_) * fVar130 + 0.5) *
                   fVar130 * fVar130;
              auVar125._0_4_ = (float)((int)fVar68 * 0x800000 + 0x3f800000) * auVar97._0_4_ + 1.0;
              auVar125._4_4_ = (float)((int)fVar71 * 0x800000 + 0x3f800000) * auVar97._4_4_ + 1.0;
              auVar125._8_4_ = (float)((int)fVar84 * 0x800000 + 0x3f800000) * auVar97._8_4_ + 1.0;
              auVar125._12_4_ = (float)((int)fVar103 * 0x800000 + 0x3f800000) * auVar97._12_4_ + 1.0
              ;
              auVar92 = rcpps(auVar97,auVar125);
              fVar68 = auVar92._0_4_;
              fVar71 = auVar92._4_4_;
              fVar84 = auVar92._8_4_;
              fVar103 = auVar92._12_4_;
              auVar76._0_4_ = (1.0 - auVar125._0_4_ * fVar68) * fVar68 + fVar68;
              auVar76._4_4_ = (1.0 - auVar125._4_4_ * fVar71) * fVar71 + fVar71;
              auVar76._8_4_ = (1.0 - auVar125._8_4_ * fVar84) * fVar84 + fVar84;
              auVar76._12_4_ = (1.0 - auVar125._12_4_ * fVar103) * fVar103 + fVar103;
              auVar56._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
              auVar56._8_4_ = -fVar54;
              auVar56._12_4_ = -fVar64;
              auVar92 = minps(auVar56,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar54 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar64 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar68 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar71 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar84 = (float)(int)fVar54;
              fVar103 = (float)(int)fVar64;
              fVar106 = (float)(int)fVar68;
              fVar107 = (float)(int)fVar71;
              fVar84 = fVar84 - (float)(-(uint)(fVar54 < fVar84) & 0x3f800000);
              fVar103 = fVar103 - (float)(-(uint)(fVar64 < fVar103) & 0x3f800000);
              fVar106 = fVar106 - (float)(-(uint)(fVar68 < fVar106) & 0x3f800000);
              fVar107 = fVar107 - (float)(-(uint)(fVar71 < fVar107) & 0x3f800000);
              fVar54 = auVar92._0_4_ - fVar84 * 0.6931472;
              fVar64 = auVar92._4_4_ - fVar103 * 0.6931472;
              fVar68 = auVar92._8_4_ - fVar106 * 0.6931472;
              fVar71 = auVar92._12_4_ - fVar107 * 0.6931472;
              auVar57._0_4_ =
                   fVar54 + 1.0 +
                   (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                     0.041665796) * fVar54 + (float)DAT_002eff30) * fVar54 + 0.5) * fVar54 * fVar54;
              auVar57._4_4_ =
                   fVar64 + 1.0 +
                   (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                     0.041665796) * fVar64 + DAT_002eff30._4_4_) * fVar64 + 0.5) * fVar64 * fVar64;
              auVar57._8_4_ =
                   fVar68 + 1.0 +
                   (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                     0.041665796) * fVar68 + DAT_002eff30._8_4_) * fVar68 + 0.5) * fVar68 * fVar68;
              auVar57._12_4_ =
                   fVar71 + 1.0 +
                   (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                     0.041665796) * fVar71 + DAT_002eff30._12_4_) * fVar71 + 0.5) * fVar71 * fVar71;
              auVar98._0_4_ = (float)((int)fVar84 * 0x800000 + 0x3f800000) * auVar57._0_4_ + 1.0;
              auVar98._4_4_ = (float)((int)fVar103 * 0x800000 + 0x3f800000) * auVar57._4_4_ + 1.0;
              auVar98._8_4_ = (float)((int)fVar106 * 0x800000 + 0x3f800000) * auVar57._8_4_ + 1.0;
              auVar98._12_4_ = (float)((int)fVar107 * 0x800000 + 0x3f800000) * auVar57._12_4_ + 1.0;
              auVar58 = rcpps(auVar57,auVar98);
              auVar118._0_4_ = (1.0 - auVar98._0_4_ * auVar58._0_4_) * auVar58._0_4_;
              auVar118._4_4_ = (1.0 - auVar98._4_4_ * auVar58._4_4_) * auVar58._4_4_;
              auVar118._8_4_ = (1.0 - auVar98._8_4_ * auVar58._8_4_) * auVar58._8_4_;
              auVar118._12_4_ = (1.0 - auVar98._12_4_ * auVar58._12_4_) * auVar58._12_4_;
LAB_002656ff:
              auVar126._0_4_ = auVar118._0_4_ + auVar58._0_4_;
              auVar126._4_4_ = auVar118._4_4_ + auVar58._4_4_;
              auVar126._8_4_ = auVar118._8_4_ + auVar58._8_4_;
              auVar126._12_4_ = auVar118._12_4_ + auVar58._12_4_;
              auVar75 = auVar76;
              auVar118 = auVar126;
              break;
            case 5:
              auVar92 = minps(auVar93,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar106 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar107 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar129 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar130 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar132 = (float)(int)fVar106;
              fVar137 = (float)(int)fVar107;
              fVar139 = (float)(int)fVar129;
              fVar140 = (float)(int)fVar130;
              fVar132 = fVar132 - (float)(-(uint)(fVar106 < fVar132) & 0x3f800000);
              fVar137 = fVar137 - (float)(-(uint)(fVar107 < fVar137) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar129 < fVar139) & 0x3f800000);
              fVar140 = fVar140 - (float)(-(uint)(fVar130 < fVar140) & 0x3f800000);
              fVar106 = auVar92._0_4_ - fVar132 * 0.6931472;
              fVar107 = auVar92._4_4_ - fVar137 * 0.6931472;
              fVar129 = auVar92._8_4_ - fVar139 * 0.6931472;
              fVar130 = auVar92._12_4_ - fVar140 * 0.6931472;
              auVar119._0_4_ =
                   (float)((int)fVar132 * 0x800000 + 0x3f800000) *
                   (fVar106 + 1.0 +
                   (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                     0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * fVar106 * fVar106) +
                   1.0;
              auVar119._4_4_ =
                   (float)((int)fVar137 * 0x800000 + 0x3f800000) *
                   (fVar107 + 1.0 +
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107) +
                   1.0;
              auVar119._8_4_ =
                   (float)((int)fVar139 * 0x800000 + 0x3f800000) *
                   (fVar129 + 1.0 +
                   (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                     0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) * fVar129 * fVar129) +
                   1.0;
              auVar119._12_4_ =
                   (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                   (fVar130 + 1.0 +
                   (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                     0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5) * fVar130 * fVar130) +
                   1.0;
              auVar92 = maxps(auVar119,_DAT_002eff40);
              fVar106 = (float)(auVar92._0_4_ & 0x807fffff | 0x3f000000);
              fVar129 = (float)(auVar92._4_4_ & 0x807fffff | 0x3f000000);
              fVar132 = (float)(auVar92._8_4_ & 0x807fffff | 0x3f000000);
              fVar139 = (float)(auVar92._12_4_ & 0x807fffff | 0x3f000000);
              fVar107 = fVar106 + -1.0 + (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
              fVar130 = fVar129 + -1.0 + (float)(-(uint)(fVar129 < 0.70710677) & (uint)fVar129);
              fVar137 = fVar132 + -1.0 + (float)(-(uint)(fVar132 < 0.70710677) & (uint)fVar132);
              fVar140 = fVar139 + -1.0 + (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar139);
              auVar120._0_8_ =
                   CONCAT44(-(uint)(auVar119._4_4_ <= 0.0),-(uint)(auVar119._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar120._8_4_ = -(uint)(auVar119._8_4_ <= 0.0) & 0x7fffffff;
              auVar120._12_4_ = -(uint)(auVar119._12_4_ <= 0.0) & 0x7fffffff;
              auVar77._0_4_ =
                   ~-(uint)(auVar119._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar106 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar107 +
                          (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984) *
                                 fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107 +
                              -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994) *
                            fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) * -2.0);
              auVar77._4_4_ =
                   ~-(uint)(auVar119._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar129 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar130 +
                          (((((((((fVar130 * 0.070376836 + -0.1151461) * fVar130 + 0.116769984) *
                                 fVar130 + -0.12420141) * fVar130 + 0.14249323) * fVar130 +
                              -0.16668057) * fVar130 + 0.20000714) * fVar130 + -0.24999994) *
                            fVar130 + 0.3333333) * fVar130 + -0.5) * fVar130 * fVar130) * -2.0);
              auVar77._8_4_ =
                   ~-(uint)(auVar119._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar132 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar137 +
                          (((((((((fVar137 * 0.070376836 + -0.1151461) * fVar137 + 0.116769984) *
                                 fVar137 + -0.12420141) * fVar137 + 0.14249323) * fVar137 +
                              -0.16668057) * fVar137 + 0.20000714) * fVar137 + -0.24999994) *
                            fVar137 + 0.3333333) * fVar137 + -0.5) * fVar137 * fVar137) * -2.0);
              auVar77._12_4_ =
                   ~-(uint)(auVar119._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar139 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar140 +
                          (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984) *
                                 fVar140 + -0.12420141) * fVar140 + 0.14249323) * fVar140 +
                              -0.16668057) * fVar140 + 0.20000714) * fVar140 + -0.24999994) *
                            fVar140 + 0.3333333) * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
              auVar92 = minps(auVar77 | auVar120,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar106 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar107 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar129 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar130 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar132 = (float)(int)fVar106;
              fVar137 = (float)(int)fVar107;
              fVar139 = (float)(int)fVar129;
              fVar140 = (float)(int)fVar130;
              fVar132 = fVar132 - (float)(-(uint)(fVar106 < fVar132) & 0x3f800000);
              fVar137 = fVar137 - (float)(-(uint)(fVar107 < fVar137) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar129 < fVar139) & 0x3f800000);
              fVar140 = fVar140 - (float)(-(uint)(fVar130 < fVar140) & 0x3f800000);
              fVar106 = auVar92._0_4_ - fVar132 * 0.6931472;
              fVar107 = auVar92._4_4_ - fVar137 * 0.6931472;
              fVar129 = auVar92._8_4_ - fVar139 * 0.6931472;
              fVar130 = auVar92._12_4_ - fVar140 * 0.6931472;
              auVar121._0_4_ = fVar106 * fVar106;
              auVar121._4_4_ = fVar107 * fVar107;
              auVar121._8_4_ = fVar129 * fVar129;
              auVar121._12_4_ = fVar130 * fVar130;
              auVar135._0_4_ =
                   (float)((int)fVar132 * 0x800000 + 0x3f800000) *
                   (fVar106 + 1.0 +
                   (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                     0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * auVar121._0_4_) + 1.0;
              auVar135._4_4_ =
                   (float)((int)fVar137 * 0x800000 + 0x3f800000) *
                   (fVar107 + 1.0 +
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * auVar121._4_4_) + 1.0;
              auVar135._8_4_ =
                   (float)((int)fVar139 * 0x800000 + 0x3f800000) *
                   (fVar129 + 1.0 +
                   (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                     0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) * auVar121._8_4_) + 1.0;
              auVar135._12_4_ =
                   (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                   (fVar130 + 1.0 +
                   (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                     0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5) * auVar121._12_4_) + 1.0;
              auVar92 = rcpps(auVar121,auVar135);
              fVar106 = auVar92._0_4_;
              fVar107 = auVar92._4_4_;
              fVar129 = auVar92._8_4_;
              fVar130 = auVar92._12_4_;
              auVar75._0_4_ =
                   (fVar106 + fVar106 + -1.0 +
                   (2.0 - auVar135._0_4_ * (fVar106 + fVar106)) * fVar106) * fVar68;
              auVar75._4_4_ =
                   (fVar107 + fVar107 + -1.0 +
                   (2.0 - auVar135._4_4_ * (fVar107 + fVar107)) * fVar107) * fVar71;
              auVar75._8_4_ =
                   (fVar129 + fVar129 + -1.0 +
                   (2.0 - auVar135._8_4_ * (fVar129 + fVar129)) * fVar129) * fVar84;
              auVar75._12_4_ =
                   (fVar130 + fVar130 + -1.0 +
                   (2.0 - auVar135._12_4_ * (fVar130 + fVar130)) * fVar130) * fVar103;
              auVar92 = minps(auVar55,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar68 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar71 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar84 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar103 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar106 = (float)(int)fVar68;
              fVar107 = (float)(int)fVar71;
              fVar129 = (float)(int)fVar84;
              fVar130 = (float)(int)fVar103;
              fVar106 = fVar106 - (float)(-(uint)(fVar68 < fVar106) & 0x3f800000);
              fVar107 = fVar107 - (float)(-(uint)(fVar71 < fVar107) & 0x3f800000);
              fVar129 = fVar129 - (float)(-(uint)(fVar84 < fVar129) & 0x3f800000);
              fVar130 = fVar130 - (float)(-(uint)(fVar103 < fVar130) & 0x3f800000);
              fVar68 = auVar92._0_4_ - fVar106 * 0.6931472;
              fVar71 = auVar92._4_4_ - fVar107 * 0.6931472;
              fVar84 = auVar92._8_4_ - fVar129 * 0.6931472;
              fVar103 = auVar92._12_4_ - fVar130 * 0.6931472;
              auVar122._0_4_ =
                   (float)((int)fVar106 * 0x800000 + 0x3f800000) *
                   (fVar68 + 1.0 +
                   (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                     0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68) + 1.0;
              auVar122._4_4_ =
                   (float)((int)fVar107 * 0x800000 + 0x3f800000) *
                   (fVar71 + 1.0 +
                   (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                     0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) + 1.0;
              auVar122._8_4_ =
                   (float)((int)fVar129 * 0x800000 + 0x3f800000) *
                   (fVar84 + 1.0 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84) + 1.0;
              auVar122._12_4_ =
                   (float)((int)fVar130 * 0x800000 + 0x3f800000) *
                   (fVar103 + 1.0 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103) +
                   1.0;
              auVar92 = maxps(auVar122,_DAT_002eff40);
              fVar68 = (float)(auVar92._0_4_ & 0x807fffff | 0x3f000000);
              fVar84 = (float)(auVar92._4_4_ & 0x807fffff | 0x3f000000);
              fVar106 = (float)(auVar92._8_4_ & 0x807fffff | 0x3f000000);
              fVar129 = (float)(auVar92._12_4_ & 0x807fffff | 0x3f000000);
              fVar71 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
              fVar103 = fVar84 + -1.0 + (float)(-(uint)(fVar84 < 0.70710677) & (uint)fVar84);
              fVar107 = fVar106 + -1.0 + (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
              fVar130 = fVar129 + -1.0 + (float)(-(uint)(fVar129 < 0.70710677) & (uint)fVar129);
              auVar123._0_8_ =
                   CONCAT44(-(uint)(auVar122._4_4_ <= 0.0),-(uint)(auVar122._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar123._8_4_ = -(uint)(auVar122._8_4_ <= 0.0) & 0x7fffffff;
              auVar123._12_4_ = -(uint)(auVar122._12_4_ <= 0.0) & 0x7fffffff;
              auVar94._0_4_ =
                   ~-(uint)(auVar122._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar68 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar71
                          + (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 + 0.116769984) *
                                   fVar71 + -0.12420141) * fVar71 + 0.14249323) * fVar71 +
                                -0.16668057) * fVar71 + 0.20000714) * fVar71 + -0.24999994) * fVar71
                             + 0.3333333) * fVar71 + -0.5) * fVar71 * fVar71) * -2.0);
              auVar94._4_4_ =
                   ~-(uint)(auVar122._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar84 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar103
                          + (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                                   fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                                -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                              fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
              auVar94._8_4_ =
                   ~-(uint)(auVar122._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar106 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar107 +
                          (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984) *
                                 fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107 +
                              -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994) *
                            fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) * -2.0);
              auVar94._12_4_ =
                   ~-(uint)(auVar122._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar92._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar129 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar130 +
                          (((((((((fVar130 * 0.070376836 + -0.1151461) * fVar130 + 0.116769984) *
                                 fVar130 + -0.12420141) * fVar130 + 0.14249323) * fVar130 +
                              -0.16668057) * fVar130 + 0.20000714) * fVar130 + -0.24999994) *
                            fVar130 + 0.3333333) * fVar130 + -0.5) * fVar130 * fVar130) * -2.0);
              auVar92 = minps(auVar94 | auVar123,_DAT_002efea0);
              auVar92 = maxps(auVar92,_DAT_002efeb0);
              fVar68 = auVar92._0_4_ * 1.442695 + 0.5;
              fVar71 = auVar92._4_4_ * 1.442695 + 0.5;
              fVar84 = auVar92._8_4_ * 1.442695 + 0.5;
              fVar103 = auVar92._12_4_ * 1.442695 + 0.5;
              fVar106 = (float)(int)fVar68;
              fVar107 = (float)(int)fVar71;
              fVar129 = (float)(int)fVar84;
              fVar130 = (float)(int)fVar103;
              fVar106 = fVar106 - (float)(-(uint)(fVar68 < fVar106) & 0x3f800000);
              fVar107 = fVar107 - (float)(-(uint)(fVar71 < fVar107) & 0x3f800000);
              fVar129 = fVar129 - (float)(-(uint)(fVar84 < fVar129) & 0x3f800000);
              fVar130 = fVar130 - (float)(-(uint)(fVar103 < fVar130) & 0x3f800000);
              fVar68 = auVar92._0_4_ - fVar106 * 0.6931472;
              fVar71 = auVar92._4_4_ - fVar107 * 0.6931472;
              fVar84 = auVar92._8_4_ - fVar129 * 0.6931472;
              fVar103 = auVar92._12_4_ - fVar130 * 0.6931472;
              auVar95._0_4_ =
                   fVar68 + 1.0 +
                   (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                     0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68;
              auVar95._4_4_ =
                   fVar71 + 1.0 +
                   (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                     0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71;
              auVar95._8_4_ =
                   fVar84 + 1.0 +
                   (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                     0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5) * fVar84 * fVar84;
              auVar95._12_4_ =
                   fVar103 + 1.0 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103;
              auVar136._0_4_ = (float)((int)fVar106 * 0x800000 + 0x3f800000) * auVar95._0_4_ + 1.0;
              auVar136._4_4_ = (float)((int)fVar107 * 0x800000 + 0x3f800000) * auVar95._4_4_ + 1.0;
              auVar136._8_4_ = (float)((int)fVar129 * 0x800000 + 0x3f800000) * auVar95._8_4_ + 1.0;
              auVar136._12_4_ = (float)((int)fVar130 * 0x800000 + 0x3f800000) * auVar95._12_4_ + 1.0
              ;
              auVar92 = rcpps(auVar95,auVar136);
              fVar68 = auVar92._0_4_;
              fVar71 = auVar92._4_4_;
              fVar84 = auVar92._8_4_;
              fVar103 = auVar92._12_4_;
              auVar128._0_4_ =
                   fVar68 + fVar68 + -1.0 + (2.0 - auVar136._0_4_ * (fVar68 + fVar68)) * fVar68;
              auVar128._4_4_ =
                   fVar71 + fVar71 + -1.0 + (2.0 - auVar136._4_4_ * (fVar71 + fVar71)) * fVar71;
              auVar128._8_4_ =
                   fVar84 + fVar84 + -1.0 + (2.0 - auVar136._8_4_ * (fVar84 + fVar84)) * fVar84;
              auVar128._12_4_ =
                   fVar103 + fVar103 + -1.0 +
                   (2.0 - auVar136._12_4_ * (fVar103 + fVar103)) * fVar103;
              goto LAB_00265749;
            case 6:
              fVar106 = **(float **)(&this->field_0x118 + (long)p_Var23);
              fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              auVar79._0_4_ = fVar106 * fVar68 + fVar107;
              auVar79._4_4_ = fVar106 * fVar71 + fVar107;
              auVar79._8_4_ = fVar106 * fVar84 + fVar107;
              auVar79._12_4_ = fVar106 * fVar103 + fVar107;
              auVar92 = maxps(auVar79,ZEXT816(0));
              auVar92 = minps(auVar92,_DAT_002efe90);
              auVar75._0_4_ = auVar92._0_4_ * fVar68;
              auVar75._4_4_ = auVar92._4_4_ * fVar71;
              auVar75._8_4_ = auVar92._8_4_ * fVar84;
              auVar75._12_4_ = auVar92._12_4_ * fVar103;
              auVar127._0_4_ = fVar106 * auVar55._0_4_ + fVar107;
              auVar127._4_4_ = fVar106 * auVar55._4_4_ + fVar107;
              auVar127._8_4_ = fVar106 * fVar54 + fVar107;
              auVar127._12_4_ = fVar106 * fVar64 + fVar107;
              auVar92 = maxps(auVar127,ZEXT816(0));
              auVar128 = minps(auVar92,_DAT_002efe90);
LAB_00265749:
              auVar118._0_4_ = auVar128._0_4_ * auVar55._0_4_;
              auVar118._4_4_ = auVar128._4_4_ * auVar55._4_4_;
              auVar118._8_4_ = auVar128._8_4_ * fVar54;
              auVar118._12_4_ = auVar128._12_4_ * fVar64;
            }
switchD_0026506b_caseD_1:
            if (iVar7 < 0x65) {
              *pauVar31 = auVar75;
              pauVar31[1] = auVar118;
              pauVar31 = pauVar31 + 2;
            }
            else {
              pfVar48 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + uVar46 * 0x20);
              pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + 0x10 +
                                uVar46 * 0x20);
              fVar54 = *pfVar48 * auVar75._0_4_;
              fVar64 = pfVar48[1] * auVar75._4_4_;
              fVar68 = pfVar48[2] * auVar75._8_4_;
              fVar71 = pfVar48[3] * auVar75._12_4_;
              fVar84 = *pfVar1 * auVar118._0_4_;
              fVar103 = pfVar1[1] * auVar118._4_4_;
              fVar106 = pfVar1[2] * auVar118._8_4_;
              fVar107 = pfVar1[3] * auVar118._12_4_;
              auVar59._0_4_ = (int)((float)((uint)fVar54 & 0x80000000 | 0x3f000000) + fVar54);
              auVar59._4_4_ = (int)((float)((uint)fVar64 & 0x80000000 | 0x3f000000) + fVar64);
              auVar59._8_4_ = (int)((float)((uint)fVar68 & 0x80000000 | 0x3f000000) + fVar68);
              auVar59._12_4_ = (int)((float)((uint)fVar71 & 0x80000000 | 0x3f000000) + fVar71);
              auVar80._0_4_ = (int)((float)((uint)fVar84 & 0x80000000 | 0x3f000000) + fVar84);
              auVar80._4_4_ = (int)((float)((uint)fVar103 & 0x80000000 | 0x3f000000) + fVar103);
              auVar80._8_4_ = (int)((float)((uint)fVar106 & 0x80000000 | 0x3f000000) + fVar106);
              auVar80._12_4_ = (int)((float)((uint)fVar107 & 0x80000000 | 0x3f000000) + fVar107);
              auVar92 = packssdw(auVar59,auVar80);
              sVar138 = auVar92._0_2_;
              uVar53 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._2_2_;
              uVar61 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._4_2_;
              uVar62 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._6_2_;
              uVar65 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._8_2_;
              uVar66 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._10_2_;
              uVar69 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              sVar138 = auVar92._12_2_;
              sVar73 = auVar92._14_2_;
              uVar70 = (ushort)(0x7f < sVar138) * 0x7f | (ushort)(0x7f >= sVar138) * sVar138;
              uVar72 = (ushort)(0x7f < sVar73) * 0x7f | (ushort)(0x7f >= sVar73) * sVar73;
              auVar60._0_2_ =
                   (ushort)((short)uVar53 < -0x7f) * -0x7f | ((short)uVar53 >= -0x7f) * uVar53;
              auVar60._2_2_ =
                   (ushort)((short)uVar61 < -0x7f) * -0x7f | ((short)uVar61 >= -0x7f) * uVar61;
              auVar60._4_2_ =
                   (ushort)((short)uVar62 < -0x7f) * -0x7f | ((short)uVar62 >= -0x7f) * uVar62;
              auVar60._6_2_ =
                   (ushort)((short)uVar65 < -0x7f) * -0x7f | ((short)uVar65 >= -0x7f) * uVar65;
              auVar60._8_2_ =
                   (ushort)((short)uVar66 < -0x7f) * -0x7f | ((short)uVar66 >= -0x7f) * uVar66;
              auVar60._10_2_ =
                   (ushort)((short)uVar69 < -0x7f) * -0x7f | ((short)uVar69 >= -0x7f) * uVar69;
              auVar60._12_2_ =
                   (ushort)((short)uVar70 < -0x7f) * -0x7f | ((short)uVar70 >= -0x7f) * uVar70;
              auVar60._14_2_ =
                   (ushort)((short)uVar72 < -0x7f) * -0x7f | ((short)uVar72 >= -0x7f) * uVar72;
              auVar92 = packsswb(auVar60,auVar60);
              *puVar44 = auVar92._0_8_;
              puVar44 = puVar44 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        iVar49 = iVar49 + (int)uVar51 * 8;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&top_blob_unpacked);
    iVar49 = 0;
    goto LAB_00264937;
  }
  sVar43 = (ulong)opt->use_packing_layout * 3 + 1;
  uVar50 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var23) & 3) != 0) {
    sVar43 = 1;
  }
  uVar9 = (uint)sVar43;
  uVar51 = (ulong)(uVar9 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var23)) {
    uVar51 = sVar43;
  }
  Mat::create(top_blob,iVar34,iVar39,(int)*(uint *)(&this->field_0xd0 + (long)p_Var23) / (int)uVar9,
              uVar51,uVar9,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00264937;
  uVar29 = (int)uVar29 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  uVar19 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    uVar50 = 1;
    if ((uVar29 & 7) == 0) {
      uVar50 = 8;
    }
    _elempack = (uint)((uVar19 & 3) == 0) * 3 + 1;
  }
  scales.refcount =
       (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  scales.data = bottom_blob_bordered.data;
  scales.elemsize = bottom_blob_bordered.elemsize;
  scales.elempack = bottom_blob_bordered.elempack;
  scales.allocator = bottom_blob_bordered.allocator;
  scales.w = bottom_blob_bordered.w;
  scales.dims = bottom_blob_bordered.dims;
  scales.d = bottom_blob_bordered.d;
  scales.h = bottom_blob_bordered.h;
  scales.c = bottom_blob_bordered.c;
  scales.cstep = bottom_blob_bordered.cstep;
  if (scales.refcount != (int *)0x0) {
    LOCK();
    *scales.refcount = *scales.refcount + 1;
    UNLOCK();
  }
  if ((int)uVar50 < iVar25) {
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    convert_packing(&bottom_blob_bordered,&scales,uVar50,(Option *)&top_blob_unpacked);
  }
  Mat::Mat(&top_blob_unpacked,top_blob);
  if (_elempack < uVar9) {
    local_2e0._0_1_ = (byte)uVar51;
    local_2d8 = (byte)sVar43;
    Mat::create(&top_blob_unpacked,iVar34,iVar39,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)_elempack,(ulong)(((byte)local_2e0 / local_2d8) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar49 = -100;
    if ((top_blob_unpacked.data != (void *)0x0) &&
       ((long)top_blob_unpacked.c * top_blob_unpacked.cstep != 0)) goto LAB_00264bbb;
  }
  else {
LAB_00264bbb:
    iVar25 = 0;
    iVar49 = 0;
    for (lVar37 = 0;
        lVar37 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
        lVar37 = lVar37 + 1) {
      Mat::channel_range((Mat *)&requantize_scales,&scales,iVar25 / (int)uVar50,
                         (int)uVar29 / (int)uVar50);
      Mat::channel_range(&top_blob_g,&top_blob_unpacked,iVar49 / (int)_elempack,
                         (int)uVar19 / (int)_elempack);
      pLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar37];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_reserved_1 = opt->use_reserved_1;
      opt_g.use_reserved_2 = opt->use_reserved_2;
      opt_g.use_reserved_3 = opt->use_reserved_3;
      opt_g.use_reserved_4 = opt->use_reserved_4;
      opt_g.use_reserved_5 = opt->use_reserved_5;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = top_blob->allocator;
      (*pLVar8->_vptr_Layer[7])(pLVar8,(Mat *)&requantize_scales,&top_blob_g,&opt_g);
      Mat::~Mat(&top_blob_g);
      Mat::~Mat((Mat *)&requantize_scales);
      iVar49 = iVar49 + uVar19;
      iVar25 = iVar25 + uVar29;
    }
    if (_elempack < uVar9) {
      convert_packing(&top_blob_unpacked,top_blob,uVar9,opt);
    }
    else {
      Mat::operator=(top_blob,&top_blob_unpacked);
    }
    iVar49 = 0;
  }
  Mat::~Mat(&top_blob_unpacked);
  Mat::~Mat(&scales);
LAB_00264937:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar49;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}